

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<wchar_t>
          (BasicWriter<wchar_t> *this,wchar_t *s,size_t size,AlignSpec *spec)

{
  uint uVar1;
  wchar_t wVar2;
  Alignment AVar3;
  BasicWriter<wchar_t> *__first;
  BasicWriter<wchar_t> *pBVar4;
  AlignSpec *in_RCX;
  ulong in_RDX;
  undefined8 in_RDI;
  wchar_t fill;
  CharPtr out;
  BasicWriter<wchar_t> *in_stack_ffffffffffffffb0;
  BasicWriter<wchar_t> *in_stack_ffffffffffffffb8;
  BasicWriter<wchar_t> *in_stack_ffffffffffffffc0;
  wchar_t fill_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  fill_00 = (wchar_t)((ulong)in_RDI >> 0x20);
  uVar1 = WidthSpec::width(&in_RCX->super_WidthSpec);
  if (in_RDX < uVar1) {
    WidthSpec::width(&in_RCX->super_WidthSpec);
    __first = (BasicWriter<wchar_t> *)
              grow_buffer(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    wVar2 = WidthSpec::fill(&in_RCX->super_WidthSpec);
    wVar2 = internal::BasicCharTraits<wchar_t>::cast(wVar2);
    AVar3 = AlignSpec::align(in_RCX);
    if (AVar3 == ALIGN_RIGHT) {
      pBVar4 = __first;
      WidthSpec::width(&in_RCX->super_WidthSpec);
      std::uninitialized_fill_n<wchar_t*,unsigned_long,wchar_t>
                ((wchar_t *)__first,(unsigned_long)in_stack_ffffffffffffffb8,
                 (wchar_t *)in_stack_ffffffffffffffb0);
      uVar1 = WidthSpec::width(&in_RCX->super_WidthSpec);
      in_stack_ffffffffffffffc0 = __first;
      __first = pBVar4 + (uVar1 - in_RDX) * 4;
    }
    else {
      AVar3 = AlignSpec::align(in_RCX);
      if (AVar3 == ALIGN_CENTER) {
        pBVar4 = __first;
        WidthSpec::width(&in_RCX->super_WidthSpec);
        pBVar4 = (BasicWriter<wchar_t> *)
                 fill_padding((CharPtr)in_RCX,(uint)((ulong)pBVar4 >> 0x20),
                              CONCAT44(wVar2,in_stack_ffffffffffffffd0),fill_00);
        in_stack_ffffffffffffffb8 = __first;
        __first = pBVar4;
      }
      else {
        in_stack_ffffffffffffffb0 = __first + in_RDX * 4;
        WidthSpec::width(&in_RCX->super_WidthSpec);
        std::uninitialized_fill_n<wchar_t*,unsigned_long,wchar_t>
                  ((wchar_t *)in_stack_ffffffffffffffc0,(unsigned_long)in_stack_ffffffffffffffb8,
                   (wchar_t *)in_stack_ffffffffffffffb0);
      }
    }
  }
  else {
    __first = (BasicWriter<wchar_t> *)
              grow_buffer(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
  }
  std::uninitialized_copy<wchar_t_const*,wchar_t*>
            ((wchar_t *)in_stack_ffffffffffffffc0,(wchar_t *)in_stack_ffffffffffffffb8,
             (wchar_t *)in_stack_ffffffffffffffb0);
  return (CharPtr)__first;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}